

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

void __thiscall Minisat::OnlineProofChecker::fullCheck(OnlineProofChecker *this)

{
  long lVar1;
  Clause *pCVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int j_1;
  int i;
  int iVar9;
  long lVar10;
  long *plVar11;
  int j;
  long lVar12;
  Lit l_1;
  Lit l;
  Lit local_44;
  uint local_40;
  Lit local_3c;
  ulong local_38;
  
  lVar10 = 0;
  do {
    if (*(int *)(this + 0x28) <= lVar10) {
      for (local_38 = 0; (int)local_38 < *(int *)(this + 0xe0);
          local_38 = (ulong)((int)local_38 + 1)) {
        local_40 = (int)local_38 * 2;
        for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
          local_44.x = iVar9 == 1 | local_40;
          plVar11 = (long *)((ulong)(uint)local_44.x * 0x10 + *(long *)(this + 0x58));
          for (lVar10 = 0; lVar10 < (int)plVar11[1]; lVar10 = lVar10 + 1) {
            uVar6 = (ulong)*(uint *)(*plVar11 + lVar10 * 8);
            if ((*(uint *)(*(long *)(this + 8) + 8 + uVar6 * 4) != (local_44.x ^ 1U)) &&
               (pCVar2 = (Clause *)(*(long *)(this + 8) + uVar6 * 4),
               *(uint *)&pCVar2[1].header.field_0x4 != (local_44.x ^ 1U))) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"wrong literals for clause [");
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              poVar5 = std::operator<<(poVar5,"] ");
              poVar5 = operator<<(poVar5,pCVar2);
              poVar5 = std::operator<<(poVar5," are watched. Found in list for ");
              poVar5 = operator<<(poVar5,&local_44);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
          }
        }
      }
      return;
    }
    uVar3 = *(uint *)(*(long *)(this + 0x20) + lVar10 * 4);
    uVar6 = *(ulong *)(*(long *)(this + 8) + (ulong)uVar3 * 4);
    if ((uVar6 & 3) == 0) {
      pCVar2 = (Clause *)(*(long *)(this + 8) + (ulong)uVar3 * 4);
      if ((uint)(uVar6 >> 0x22) == 1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"there should not be unit clauses! [");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,"]");
        poVar5 = operator<<(poVar5,pCVar2);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          uVar6 = (long)*(int *)(&pCVar2[1].header.field_0x0 + lVar12 * 4) ^ 1;
          local_3c.x = (int)uVar6;
          lVar7 = uVar6 * 0x10;
          uVar4 = *(uint *)(*(long *)(this + 0x58) + 8 + lVar7);
          uVar6 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar6 = 0;
          }
          uVar8 = 0;
          do {
            if (uVar6 == uVar8) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"could not find clause[");
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              poVar5 = std::operator<<(poVar5,"] ");
              poVar5 = operator<<(poVar5,pCVar2);
              poVar5 = std::operator<<(poVar5," in watcher for lit ");
              poVar5 = operator<<(poVar5,&local_3c);
              std::endl<char,std::char_traits<char>>(poVar5);
              break;
            }
            lVar1 = uVar8 * 8;
            uVar8 = uVar8 + 1;
          } while (*(uint *)(*(long *)(*(long *)(this + 0x58) + lVar7) + lVar1) != uVar3);
        }
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

inline void OnlineProofChecker::fullCheck()
{
    for (int i = 0; i < clauses.size(); ++i) {
        const CRef cr = clauses[i];
        const Clause &c = ca[cr];
        if (c.mark()) {
            continue;
        }

        if (c.size() == 1) {
            std::cerr << "there should not be unit clauses! [" << cr << "]" << c << std::endl;
        } else {
            for (int j = 0; j < 2; ++j) {
                const Lit l = ~c[j];
                vec<Watcher> &ws = watches[l];
                bool didFind = false;
                for (int j = 0; j < ws.size(); ++j) {
                    CRef wcr = ws[j].cref;
                    if (wcr == cr) {
                        didFind = true;
                        break;
                    }
                }
                if (!didFind) {
                    std::cerr << "could not find clause[" << cr << "] " << c << " in watcher for lit " << l << std::endl;
                }
            }
        }
    }

    for (Var v = 0; v < nVars(); ++v) {
        for (int p = 0; p < 2; ++p) {
            const Lit l = mkLit(v, p == 1);
            vec<Watcher> &ws = watches[l];
            for (int j = 0; j < ws.size(); ++j) {
                CRef wcr = ws[j].cref;
                const Clause &c = ca[wcr];
                if (c[0] != ~l && c[1] != ~l) {
                    std::cerr << "wrong literals for clause [" << wcr << "] " << c << " are watched. Found in list for "
                              << l << std::endl;
                }
            }
        }
    }
}